

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_19bb9b::FilteredDirectoryContentsTask::provideValue
          (FilteredDirectoryContentsTask *this,TaskInterface param_1,uintptr_t inputID,KeyType *key,
          ValueType *value)

{
  BinaryDecoder local_98;
  BuildValue local_80;
  
  if (inputID == 1) {
    local_98.data.Data =
         (char *)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
    local_98.data.Length =
         (long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)local_98.data.Data;
    local_98.pos = 0;
    llbuild::buildsystem::BuildValue::BuildValue(&local_80,&local_98);
    llbuild::buildsystem::BuildValue::operator=(&this->directoryValue,&local_80);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_80);
  }
  return;
}

Assistant:

virtual void provideValue(TaskInterface, uintptr_t inputID,
                            const KeyType& key, const ValueType& value) override {
    if (inputID == 1) {
      directoryValue = BuildValue::fromData(value);
      return;
    }
  }